

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O3

void __thiscall KDReports::Test::testSimpleScaleTo(Test *this)

{
  Data *pDVar1;
  QRect *pQVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  AutoTableElement *pAVar7;
  reference pQVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<QRect> local_b8;
  QArrayDataPointer<QRect> local_98;
  Report report;
  char *local_78;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QByteArrayView local_28;
  char *local_18;
  
  if (fontFound) {
    fillModel(this,4,8,false);
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&report);
    local_98.d = (Data *)0x0;
    local_98.ptr = (QRect *)0x0;
    local_98.size = 0;
    QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_48,"Noto Sans",9);
    QVar9.m_data = (storage_type *)local_48.d;
    QVar9.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar9);
    qVar3 = local_98.size;
    pQVar2 = local_98.ptr;
    pDVar1 = local_98.d;
    local_98.d = local_b8.d;
    local_98.ptr = local_b8.ptr;
    local_b8.d = pDVar1;
    local_b8.ptr = pQVar2;
    local_98.size = local_b8.size;
    local_b8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QFont::QFont((QFont *)&local_68,(QString *)&local_98,0xe,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&report);
    QFont::~QFont((QFont *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    pAVar7 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_b8,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar7);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_b8);
    KDReports::Report::scaleTo((int)&report,1);
    iVar6 = KDReports::Report::numberOfPages();
    cVar4 = QTest::qCompare(iVar6,1,"report.numberOfPages()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0xcc);
    if (cVar4 != '\0') {
      KDReports::Report::mainTable();
      local_b8.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
      local_98.d = (Data *)0x3ff0000000000000;
      cVar4 = QTest::qCompare((double *)&local_b8,(double *)&local_98,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0xcd);
      if (cVar4 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_98.d = (Data *)0x0;
        local_98.ptr = (QRect *)0x0;
        local_98.size = 0;
        local_48.d = (Data *)0x0;
        local_48.ptr = (char16_t *)0x700000003;
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                  ((QMovableArrayOps<QRect> *)&local_98,0,(QRect *)&local_48);
        bVar5 = QTest::_q_compareSequence<QList<QRect>::const_iterator,QList<QRect>::const_iterator>
                          ((const_iterator)local_b8.ptr,local_b8.ptr + local_b8.size,
                           (const_iterator)local_98.ptr,local_98.ptr + local_98.size,
                           "report.mainTable()->pageRects()","QList<QRect>() << QRect(0, 0, 4, 8)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xce);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
        if (bVar5) {
          KDReports::Report::scaleTo((int)&report,4);
          iVar6 = KDReports::Report::numberOfPages();
          cVar4 = QTest::qCompare(iVar6,4,"report.numberOfPages()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                  ,0xd0);
          if (cVar4 != '\0') {
            KDReports::Report::mainTable();
            local_b8.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
            local_98.d = (Data *)0x3ff0000000000000;
            cVar4 = QTest::qCompare((double *)&local_b8,(double *)&local_98,
                                    "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0xd1);
            if (cVar4 != '\0') {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar8 = QList<QRect>::operator[]((QList<QRect> *)&local_b8,0);
              local_98.d = (Data *)0x0;
              local_98.ptr = (QRect *)0x700000000;
              bVar5 = QTest::qCompare<QRect,QRect>
                                (pQVar8,(QRect *)&local_98,"report.mainTable()->pageRects()[0]",
                                 "QRect(0, 0, 1, 8)",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0xd2);
              QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
              if (bVar5) {
                KDReports::Report::mainTable();
                KDReports::MainTable::pageRects();
                pQVar8 = QList<QRect>::operator[]((QList<QRect> *)&local_b8,1);
                local_98.d = (Data *)0x1;
                local_98.ptr = (QRect *)0x700000001;
                bVar5 = QTest::qCompare<QRect,QRect>
                                  (pQVar8,(QRect *)&local_98,"report.mainTable()->pageRects()[1]",
                                   "QRect(1, 0, 1, 8)",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0xd3);
                QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
                if (bVar5) {
                  KDReports::Report::mainTable();
                  KDReports::MainTable::pageRects();
                  pQVar8 = QList<QRect>::operator[]((QList<QRect> *)&local_b8,2);
                  local_98.d = (Data *)0x2;
                  local_98.ptr = (QRect *)0x700000002;
                  bVar5 = QTest::qCompare<QRect,QRect>
                                    (pQVar8,(QRect *)&local_98,"report.mainTable()->pageRects()[2]",
                                     "QRect(2, 0, 1, 8)",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0xd4);
                  QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
                  if (bVar5) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar8 = QList<QRect>::operator[]((QList<QRect> *)&local_b8,3);
                    local_98.d = (Data *)0x3;
                    local_98.ptr = (QRect *)0x700000003;
                    QTest::qCompare<QRect,QRect>
                              (pQVar8,(QRect *)&local_98,"report.mainTable()->pageRects()[3]",
                               "QRect(3, 0, 1, 8)",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xd5);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
                  }
                }
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  else {
    local_28.m_size = 0x10c8fb;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_68,(char **)&local_28);
    QVar10.m_data = (storage_type *)local_68.d;
    QVar10.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar10);
    local_48.ptr = (char16_t *)local_b8.ptr;
    local_48.d = (Data *)local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QRect *)0x0;
    local_48.size = local_b8.size;
    local_b8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    local_18 = "Noto Sans";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_28,&local_18);
    QVar11.m_data = (storage_type *)local_28.m_size;
    QVar11.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar11);
    local_68.ptr = (char16_t *)local_b8.ptr;
    local_68.d = (Data *)local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QRect *)0x0;
    local_68.size = local_b8.size;
    local_b8.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QString::arg((QString *)&local_98,(int)&local_48,(QChar)(char16_t)&local_68);
    QString::toLatin1_helper_inplace((QString *)&report);
    if (local_78 == (char *)0x0) {
      local_78 = (char *)&QByteArray::_empty;
    }
    QTest::qSkip(local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0xc4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&report);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  return;
}

Assistant:

void testSimpleScaleTo()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(4, 8);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 14));
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 4);
        QCOMPARE(report.numberOfPages(), 1); // it fits
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 4, 8));
        report.scaleTo(4, 1);
        QCOMPARE(report.numberOfPages(), 4); // one column per page
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(1, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[2], QRect(2, 0, 1, 8));
        QCOMPARE(report.mainTable()->pageRects()[3], QRect(3, 0, 1, 8));
    }